

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfgconv.cpp
# Opt level: O0

bool isAddrInRange(Addr addr)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  _Self local_28;
  const_iterator ed;
  const_iterator it;
  Addr addr_local;
  
  sVar2 = std::__cxx11::
          list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::size(&config.ranges);
  if (sVar2 == 0) {
    addr_local._7_1_ = true;
  }
  else {
    ed = std::__cxx11::
         list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ::cbegin(&config.ranges);
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ::cend(&config.ranges);
    while (bVar1 = std::operator!=(&ed,&local_28), bVar1) {
      ppVar3 = std::_List_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::operator->(&ed);
      if ((ppVar3->first <= addr) &&
         (ppVar3 = std::_List_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::operator->
                             (&ed), addr <= ppVar3->second)) {
        return true;
      }
      std::_List_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::operator++(&ed,0);
    }
    addr_local._7_1_ = false;
  }
  return addr_local._7_1_;
}

Assistant:

bool isAddrInRange(Addr addr) {
	// if the range list is empty, consider the address in range.
	if (config.ranges.size() == 0)
		return true;

	for (std::list<std::pair<Addr, Addr> >::const_iterator it =  config.ranges.cbegin(),
			ed = config.ranges.cend(); it != ed; it++) {
		if (addr >= it->first && addr <= it->second)
			return true;
	}

	return false;
}